

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<std::complex<float>_>::Transpose
          (TPZBlockDiagonal<std::complex<float>_> *this,TPZMatrix<std::complex<float>_> *T)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int64_t iVar5;
  long *plVar6;
  int *piVar7;
  complex<float> *pcVar8;
  long *in_RSI;
  long *in_RDI;
  int64_t nb;
  int c;
  int r;
  int bsize;
  int64_t pos;
  int64_t eq;
  int64_t b;
  int local_34;
  int local_30;
  long local_20;
  int64_t local_18;
  
  uVar3 = (**(code **)(*in_RDI + 0x60))();
  uVar4 = (**(code **)(*in_RDI + 0x60))();
  (**(code **)(*in_RSI + 0x68))(in_RSI,uVar3,uVar4);
  local_20 = 0;
  iVar5 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0xc));
  for (local_18 = 0; local_18 < iVar5; local_18 = local_18 + 1) {
    plVar6 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 8),local_18);
    lVar2 = *plVar6;
    piVar7 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0xc),local_18);
    iVar1 = *piVar7;
    for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < iVar1; local_34 = local_34 + 1) {
        pcVar8 = TPZVec<std::complex<float>_>::operator[]
                           ((TPZVec<std::complex<float>_> *)(in_RDI + 4),
                            lVar2 + local_34 + (long)(local_30 * iVar1));
        (**(code **)(*in_RSI + 0x118))(in_RSI,local_20 + local_30,local_20 + local_34,pcVar8);
      }
    }
    local_20 = iVar1 + local_20;
  }
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::Transpose (TPZMatrix<TVar> *const T) const
{
	T->Resize( Dim(), Dim() );
	
	int64_t b, eq = 0, pos;
	int bsize, r, c;
	int64_t nb = fBlockSize.NElements();
	for ( b=0; b<nb; b++) {
		pos= fBlockPos[b];
		bsize = fBlockSize[b];
		for(r=0; r<bsize; r++) {
			for(c=0; c<bsize; c++) {
				T->PutVal(eq+r,eq+c,fStorage[pos+c+r*bsize]);
			}
		}
		eq += bsize;
	}
}